

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spline.cpp
# Opt level: O3

VectorNd __thiscall HermiteSpline<3U,_1U>::interpolate(HermiteSpline<3U,_1U> *this,double s)

{
  double dVar1;
  long lVar2;
  VectorNd *p;
  long lVar3;
  long *in_RSI;
  double s_;
  plain_array<double,_1,_0,_0> pVar4;
  double dVar5;
  double dVar6;
  
  lVar2 = *in_RSI;
  dVar1 = *(double *)(lVar2 + 0x20);
  if ((dVar1 < s) && (in_RSI[1] != lVar2)) {
    do {
      s = s - dVar1;
    } while (dVar1 < s);
  }
  dVar5 = 1.0;
  if (s <= 1.0) {
    dVar5 = s;
  }
  pVar4.array[0] = (double  [1])0x0;
  lVar3 = 0;
  dVar6 = 1.0;
  do {
    pVar4.array[0] = (double  [1])((double)pVar4.array[0] + dVar6 * *(double *)(lVar2 + lVar3 * 8));
    lVar3 = lVar3 + 1;
    dVar6 = (dVar5 / dVar1) * dVar6;
  } while (lVar3 != 4);
  (this->children).
  super__Vector_base<UnitBoundedPolynomial<3U,_1U>,_std::allocator<UnitBoundedPolynomial<3U,_1U>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)pVar4.array[0];
  return (VectorNd)pVar4.array[0];
}

Assistant:

typename HermiteSpline<Order, Dims>::VectorNd HermiteSpline<Order, Dims>::interpolate(double s)
{
    int m = 0;
    double s_ = s;

    while (s_ > children[m].length && m < children.size())
    {
        s_ -= children[m].length;
    }

    if (s_ >= 1.0)
    {
        s_ = 1.0;
    }

    return children[m].interpolate(s_ / children[m].length);
}